

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  undefined4 *puVar8;
  float *pfVar9;
  undefined4 *puVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  size_t sVar31;
  undefined8 uVar32;
  Scene *pSVar33;
  Ref<embree::Geometry> *pRVar34;
  Geometry *pGVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  RTCFilterFunctionN p_Var42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar50;
  int iVar51;
  int iVar52;
  undefined4 uVar53;
  AABBNodeMB4D *node1;
  ulong uVar54;
  long lVar55;
  long lVar56;
  ulong uVar57;
  uint uVar59;
  Scene *pSVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  ulong uVar77;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar78;
  size_t sVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar101;
  float fVar103;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar102;
  float fVar104;
  float fVar105;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar100;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar113 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar157;
  float fVar162;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar153;
  undefined1 auVar154 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar185;
  float fVar191;
  float fVar192;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar193;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar198;
  undefined1 auVar199 [16];
  float fVar200;
  float fVar203;
  float fVar204;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar207 [16];
  float fVar211;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar212 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  uint uVar229;
  float fVar230;
  uint uVar231;
  float fVar232;
  uint uVar233;
  float fVar234;
  uint uVar235;
  float fVar236;
  float fVar237;
  int iVar238;
  float fVar239;
  int iVar240;
  float fVar241;
  int iVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 local_1378 [16];
  undefined8 local_1338;
  float fStack_1330;
  float fStack_132c;
  undefined1 local_1328 [8];
  undefined8 uStack_1320;
  vbool<4> valid;
  float fStack_12d0;
  float fStack_12cc;
  undefined1 local_12c8 [16];
  undefined8 local_12b8;
  float fStack_12b0;
  float fStack_12ac;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [8];
  undefined8 uStack_1290;
  RTCFilterFunctionNArguments args;
  float fStack_1250;
  float fStack_124c;
  undefined8 local_1248;
  float fStack_1234;
  vfloat<4> tNear;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [16];
  int local_10a8;
  int iStack_10a4;
  int iStack_10a0;
  int iStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined4 local_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 local_1008;
  undefined4 uStack_1004;
  undefined4 uStack_1000;
  undefined4 uStack_ffc;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  uint local_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint local_fc8;
  uint uStack_fc4;
  uint uStack_fc0;
  uint uStack_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar58;
  
  pSVar78 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar80 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar145 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar172 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar81 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar185 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar51 = (tray->tnear).field_0.i[k];
  iVar238 = (tray->tfar).field_0.i[k];
  auVar181._4_4_ = iVar238;
  auVar181._0_4_ = iVar238;
  auVar181._8_4_ = iVar238;
  auVar181._12_4_ = iVar238;
  local_fa8 = mm_lookupmask_ps._0_8_;
  uStack_fa0 = mm_lookupmask_ps._8_8_;
  local_fb8 = mm_lookupmask_ps._240_8_;
  uStack_fb0 = mm_lookupmask_ps._248_8_;
  pSVar60 = (Scene *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_f98 = fVar80;
  fStack_f94 = fVar80;
  fStack_f90 = fVar80;
  fStack_f8c = fVar80;
  local_1058 = fVar145;
  fStack_1054 = fVar145;
  fStack_1050 = fVar145;
  fStack_104c = fVar145;
  local_1068 = fVar172;
  fStack_1064 = fVar172;
  fStack_1060 = fVar172;
  fStack_105c = fVar172;
  local_1078 = fVar81;
  fStack_1074 = fVar81;
  fStack_1070 = fVar81;
  fStack_106c = fVar81;
  local_1088 = fVar82;
  fStack_1084 = fVar82;
  fStack_1080 = fVar82;
  fStack_107c = fVar82;
  local_1098 = fVar185;
  fStack_1094 = fVar185;
  fStack_1090 = fVar185;
  fStack_108c = fVar185;
  local_10a8 = iVar51;
  iStack_10a4 = iVar51;
  iStack_10a0 = iVar51;
  iStack_109c = iVar51;
  fVar101 = fVar145;
  fVar102 = fVar145;
  fVar191 = fVar145;
  fVar103 = fVar172;
  fVar104 = fVar172;
  fVar105 = fVar172;
  fVar106 = fVar81;
  fVar107 = fVar81;
  fVar108 = fVar81;
  fVar109 = fVar82;
  fVar110 = fVar82;
  fVar111 = fVar82;
  fVar112 = fVar185;
  fVar124 = fVar185;
  fVar125 = fVar185;
  iVar238 = iVar51;
  iVar240 = iVar51;
  iVar242 = iVar51;
  fVar146 = fVar80;
  fVar126 = fVar80;
  fVar127 = fVar80;
LAB_0071a46e:
  do {
    do {
      if (pSVar78 == stack) {
        return;
      }
      pSVar50 = pSVar78 + -1;
      pSVar78 = pSVar78 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar50->dist &&
             (float)pSVar50->dist != *(float *)(ray + k * 4 + 0x80));
    sVar79 = (pSVar78->ptr).ptr;
    while ((sVar79 & 8) == 0) {
      uVar54 = sVar79 & 0xfffffffffffffff0;
      fVar128 = *(float *)(ray + k * 4 + 0x70);
      pfVar28 = (float *)(uVar54 + 0x80 + uVar73);
      pfVar27 = (float *)(uVar54 + 0x20 + uVar73);
      auVar173._0_4_ = ((*pfVar28 * fVar128 + *pfVar27) - fVar80) * fVar81;
      auVar173._4_4_ = ((pfVar28[1] * fVar128 + pfVar27[1]) - fVar146) * fVar106;
      auVar173._8_4_ = ((pfVar28[2] * fVar128 + pfVar27[2]) - fVar126) * fVar107;
      auVar173._12_4_ = ((pfVar28[3] * fVar128 + pfVar27[3]) - fVar127) * fVar108;
      auVar151._4_4_ = iVar238;
      auVar151._0_4_ = iVar51;
      auVar151._8_4_ = iVar240;
      auVar151._12_4_ = iVar242;
      auVar151 = maxps(auVar151,auVar173);
      pfVar28 = (float *)(uVar54 + 0x80 + uVar67);
      pfVar27 = (float *)(uVar54 + 0x20 + uVar67);
      auVar196._0_4_ = ((*pfVar28 * fVar128 + *pfVar27) - fVar145) * fVar82;
      auVar196._4_4_ = ((pfVar28[1] * fVar128 + pfVar27[1]) - fVar101) * fVar109;
      auVar196._8_4_ = ((pfVar28[2] * fVar128 + pfVar27[2]) - fVar102) * fVar110;
      auVar196._12_4_ = ((pfVar28[3] * fVar128 + pfVar27[3]) - fVar191) * fVar111;
      pfVar28 = (float *)(uVar54 + 0x80 + uVar66);
      pfVar27 = (float *)(uVar54 + 0x20 + uVar66);
      auVar197._0_4_ = ((*pfVar28 * fVar128 + *pfVar27) - fVar172) * fVar185;
      auVar197._4_4_ = ((pfVar28[1] * fVar128 + pfVar27[1]) - fVar103) * fVar112;
      auVar197._8_4_ = ((pfVar28[2] * fVar128 + pfVar27[2]) - fVar104) * fVar124;
      auVar197._12_4_ = ((pfVar28[3] * fVar128 + pfVar27[3]) - fVar105) * fVar125;
      auVar173 = maxps(auVar196,auVar197);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar151,auVar173);
      pfVar28 = (float *)(uVar54 + 0x80 + (uVar73 ^ 0x10));
      pfVar27 = (float *)(uVar54 + 0x20 + (uVar73 ^ 0x10));
      auVar202._0_4_ = ((*pfVar28 * fVar128 + *pfVar27) - fVar80) * fVar81;
      auVar202._4_4_ = ((pfVar28[1] * fVar128 + pfVar27[1]) - fVar146) * fVar106;
      auVar202._8_4_ = ((pfVar28[2] * fVar128 + pfVar27[2]) - fVar126) * fVar107;
      auVar202._12_4_ = ((pfVar28[3] * fVar128 + pfVar27[3]) - fVar127) * fVar108;
      auVar151 = minps(auVar181,auVar202);
      pfVar28 = (float *)(uVar54 + 0x80 + (uVar67 ^ 0x10));
      pfVar27 = (float *)(uVar54 + 0x20 + (uVar67 ^ 0x10));
      auVar186._0_4_ = ((*pfVar28 * fVar128 + *pfVar27) - fVar145) * fVar82;
      auVar186._4_4_ = ((pfVar28[1] * fVar128 + pfVar27[1]) - fVar101) * fVar109;
      auVar186._8_4_ = ((pfVar28[2] * fVar128 + pfVar27[2]) - fVar102) * fVar110;
      auVar186._12_4_ = ((pfVar28[3] * fVar128 + pfVar27[3]) - fVar191) * fVar111;
      pfVar28 = (float *)(uVar54 + 0x80 + (uVar66 ^ 0x10));
      pfVar27 = (float *)(uVar54 + 0x20 + (uVar66 ^ 0x10));
      auVar194._0_4_ = ((*pfVar28 * fVar128 + *pfVar27) - fVar172) * fVar185;
      auVar194._4_4_ = ((pfVar28[1] * fVar128 + pfVar27[1]) - fVar103) * fVar112;
      auVar194._8_4_ = ((pfVar28[2] * fVar128 + pfVar27[2]) - fVar104) * fVar124;
      auVar194._12_4_ = ((pfVar28[3] * fVar128 + pfVar27[3]) - fVar105) * fVar125;
      auVar173 = minps(auVar186,auVar194);
      auVar151 = minps(auVar151,auVar173);
      if (((uint)sVar79 & 7) == 6) {
        bVar43 = (fVar128 < *(float *)(uVar54 + 0xf0) && *(float *)(uVar54 + 0xe0) <= fVar128) &&
                 tNear.field_0._0_4_ <= auVar151._0_4_;
        bVar44 = (fVar128 < *(float *)(uVar54 + 0xf4) && *(float *)(uVar54 + 0xe4) <= fVar128) &&
                 tNear.field_0._4_4_ <= auVar151._4_4_;
        bVar45 = (fVar128 < *(float *)(uVar54 + 0xf8) && *(float *)(uVar54 + 0xe8) <= fVar128) &&
                 tNear.field_0._8_4_ <= auVar151._8_4_;
        bVar46 = (fVar128 < *(float *)(uVar54 + 0xfc) && *(float *)(uVar54 + 0xec) <= fVar128) &&
                 tNear.field_0._12_4_ <= auVar151._12_4_;
      }
      else {
        bVar43 = tNear.field_0._0_4_ <= auVar151._0_4_;
        bVar44 = tNear.field_0._4_4_ <= auVar151._4_4_;
        bVar45 = tNear.field_0._8_4_ <= auVar151._8_4_;
        bVar46 = tNear.field_0._12_4_ <= auVar151._12_4_;
      }
      auVar83._0_4_ = (uint)bVar43 * -0x80000000;
      auVar83._4_4_ = (uint)bVar44 * -0x80000000;
      auVar83._8_4_ = (uint)bVar45 * -0x80000000;
      auVar83._12_4_ = (uint)bVar46 * -0x80000000;
      uVar59 = movmskps((int)pSVar60,auVar83);
      pSVar60 = (Scene *)(ulong)uVar59;
      if (uVar59 == 0) goto LAB_0071a46e;
      pSVar60 = (Scene *)0x0;
      if ((byte)uVar59 != 0) {
        for (; ((byte)uVar59 >> (long)pSVar60 & 1) == 0;
            pSVar60 = (Scene *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                       super_RefCount._vptr_RefCount + 1)) {
        }
      }
      sVar79 = *(size_t *)(uVar54 + (long)pSVar60 * 8);
      uVar59 = (uVar59 & 0xff) - 1 & uVar59 & 0xff;
      if (uVar59 != 0) {
        uVar229 = tNear.field_0.i[(long)pSVar60];
        lVar56 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
          }
        }
        sVar31 = *(size_t *)(uVar54 + lVar56 * 8);
        uVar231 = tNear.field_0.i[lVar56];
        uVar59 = uVar59 - 1 & uVar59;
        pSVar60 = (Scene *)(ulong)uVar59;
        if (uVar59 == 0) {
          if (uVar229 < uVar231) {
            (pSVar78->ptr).ptr = sVar31;
            pSVar78->dist = uVar231;
            pSVar78 = pSVar78 + 1;
          }
          else {
            (pSVar78->ptr).ptr = sVar79;
            pSVar78->dist = uVar229;
            pSVar78 = pSVar78 + 1;
            sVar79 = sVar31;
          }
        }
        else {
          auVar152._8_4_ = uVar229;
          auVar152._0_8_ = sVar79;
          auVar152._12_4_ = 0;
          auVar187._8_4_ = uVar231;
          auVar187._0_8_ = sVar31;
          auVar187._12_4_ = 0;
          lVar56 = 0;
          if (pSVar60 != (Scene *)0x0) {
            for (; (uVar59 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
            }
          }
          uVar32 = *(undefined8 *)(uVar54 + lVar56 * 8);
          iVar52 = tNear.field_0.i[lVar56];
          auVar174._8_4_ = iVar52;
          auVar174._0_8_ = uVar32;
          auVar174._12_4_ = 0;
          auVar84._8_4_ = -(uint)((int)uVar229 < (int)uVar231);
          uVar59 = uVar59 - 1 & uVar59;
          if (uVar59 == 0) {
            auVar84._4_4_ = auVar84._8_4_;
            auVar84._0_4_ = auVar84._8_4_;
            auVar84._12_4_ = auVar84._8_4_;
            auVar195._8_4_ = uVar231;
            auVar195._0_8_ = sVar31;
            auVar195._12_4_ = 0;
            auVar196 = blendvps(auVar195,auVar152,auVar84);
            auVar151 = blendvps(auVar152,auVar187,auVar84);
            auVar85._8_4_ = -(uint)(auVar196._8_4_ < iVar52);
            auVar85._4_4_ = auVar85._8_4_;
            auVar85._0_4_ = auVar85._8_4_;
            auVar85._12_4_ = auVar85._8_4_;
            auVar188._8_4_ = iVar52;
            auVar188._0_8_ = uVar32;
            auVar188._12_4_ = 0;
            auVar173 = blendvps(auVar188,auVar196,auVar85);
            auVar196 = blendvps(auVar196,auVar174,auVar85);
            auVar86._8_4_ = -(uint)(auVar151._8_4_ < auVar196._8_4_);
            auVar86._4_4_ = auVar86._8_4_;
            auVar86._0_4_ = auVar86._8_4_;
            auVar86._12_4_ = auVar86._8_4_;
            SVar175 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar196,auVar151,auVar86);
            SVar153 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar151,auVar196,auVar86);
            *pSVar78 = SVar153;
            pSVar78[1] = SVar175;
            sVar79 = auVar173._0_8_;
            pSVar78 = pSVar78 + 2;
          }
          else {
            pSVar60 = (Scene *)0x0;
            if (uVar59 != 0) {
              for (; (uVar59 >> (long)pSVar60 & 1) == 0;
                  pSVar60 = (Scene *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.
                                             super_RefCount._vptr_RefCount + 1)) {
              }
            }
            auVar87._4_4_ = auVar84._8_4_;
            auVar87._0_4_ = auVar84._8_4_;
            auVar87._8_4_ = auVar84._8_4_;
            auVar87._12_4_ = auVar84._8_4_;
            auVar197 = blendvps(auVar187,auVar152,auVar87);
            auVar151 = blendvps(auVar152,auVar187,auVar87);
            auVar201._8_4_ = tNear.field_0.i[(long)pSVar60];
            auVar201._0_8_ = *(undefined8 *)(uVar54 + (long)pSVar60 * 8);
            auVar201._12_4_ = 0;
            auVar88._8_4_ = -(uint)(iVar52 < tNear.field_0.i[(long)pSVar60]);
            auVar88._4_4_ = auVar88._8_4_;
            auVar88._0_4_ = auVar88._8_4_;
            auVar88._12_4_ = auVar88._8_4_;
            auVar196 = blendvps(auVar201,auVar174,auVar88);
            auVar173 = blendvps(auVar174,auVar201,auVar88);
            auVar89._8_4_ = -(uint)(auVar151._8_4_ < auVar173._8_4_);
            auVar89._4_4_ = auVar89._8_4_;
            auVar89._0_4_ = auVar89._8_4_;
            auVar89._12_4_ = auVar89._8_4_;
            auVar202 = blendvps(auVar173,auVar151,auVar89);
            SVar153 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar151,auVar173,auVar89);
            auVar90._8_4_ = -(uint)(auVar197._8_4_ < auVar196._8_4_);
            auVar90._4_4_ = auVar90._8_4_;
            auVar90._0_4_ = auVar90._8_4_;
            auVar90._12_4_ = auVar90._8_4_;
            auVar151 = blendvps(auVar196,auVar197,auVar90);
            auVar173 = blendvps(auVar197,auVar196,auVar90);
            auVar91._8_4_ = -(uint)(auVar173._8_4_ < auVar202._8_4_);
            auVar91._4_4_ = auVar91._8_4_;
            auVar91._0_4_ = auVar91._8_4_;
            auVar91._12_4_ = auVar91._8_4_;
            SVar175 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar202,auVar173,auVar91);
            SVar198 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar173,auVar202,auVar91);
            *pSVar78 = SVar153;
            pSVar78[1] = SVar198;
            pSVar78[2] = SVar175;
            sVar79 = auVar151._0_8_;
            pSVar78 = pSVar78 + 3;
          }
        }
      }
    }
    uVar54 = sVar79 & 0xfffffffffffffff0;
    for (lVar56 = 0; lVar56 != (ulong)((uint)sVar79 & 0xf) - 8; lVar56 = lVar56 + 1) {
      lVar74 = lVar56 * 0x60;
      pSVar33 = context->scene;
      pRVar34 = (pSVar33->geometries).items;
      pGVar35 = pRVar34[*(uint *)(uVar54 + 0x40 + lVar74)].ptr;
      fVar80 = (pGVar35->time_range).lower;
      fVar145 = (pGVar35->time_range).upper - fVar80;
      fVar172 = ((*(float *)(ray + k * 4 + 0x70) - fVar80) / fVar145) * pGVar35->fnumTimeSegments;
      auVar154 = roundss(ZEXT416((uint)fVar145),ZEXT416((uint)fVar172),9);
      fVar80 = pGVar35->fnumTimeSegments + -1.0;
      if (fVar80 <= auVar154._0_4_) {
        auVar154._0_4_ = fVar80;
      }
      fVar80 = 0.0;
      if (0.0 <= auVar154._0_4_) {
        fVar80 = auVar154._0_4_;
      }
      lVar75 = (long)(int)fVar80 * 0x38;
      lVar36 = *(long *)(*(long *)&pGVar35[2].numPrimitives + lVar75);
      uVar68 = (ulong)*(uint *)(uVar54 + 4 + lVar74);
      pfVar27 = (float *)(lVar36 + (ulong)*(uint *)(uVar54 + lVar74) * 4);
      uVar57 = (ulong)*(uint *)(uVar54 + 0x10 + lVar74);
      lVar1 = lVar36 + uVar57 * 4;
      uVar58 = (ulong)*(uint *)(uVar54 + 0x20 + lVar74);
      pfVar28 = (float *)(lVar36 + uVar58 * 4);
      uVar61 = (ulong)*(uint *)(uVar54 + 0x30 + lVar74);
      pfVar2 = (float *)(lVar36 + uVar61 * 4);
      lVar37 = *(long *)&pRVar34[*(uint *)(uVar54 + 0x44 + lVar74)].ptr[2].numPrimitives;
      lVar38 = *(long *)(lVar37 + lVar75);
      pfVar3 = (float *)(lVar38 + uVar68 * 4);
      uVar62 = (ulong)*(uint *)(uVar54 + 0x14 + lVar74);
      lVar36 = lVar38 + uVar62 * 4;
      uVar63 = (ulong)*(uint *)(uVar54 + 0x24 + lVar74);
      pfVar4 = (float *)(lVar38 + uVar63 * 4);
      uVar64 = (ulong)*(uint *)(uVar54 + 0x34 + lVar74);
      pfVar5 = (float *)(lVar38 + uVar64 * 4);
      lVar39 = *(long *)&pRVar34[*(uint *)(uVar54 + 0x48 + lVar74)].ptr[2].numPrimitives;
      lVar40 = *(long *)(lVar39 + lVar75);
      uVar65 = (ulong)*(uint *)(uVar54 + 8 + lVar74);
      pfVar6 = (float *)(lVar40 + uVar65 * 4);
      uVar70 = (ulong)*(uint *)(uVar54 + 0x18 + lVar74);
      lVar38 = lVar40 + uVar70 * 4;
      uVar71 = (ulong)*(uint *)(uVar54 + 0x28 + lVar74);
      lVar7 = lVar40 + uVar71 * 4;
      uVar72 = (ulong)*(uint *)(uVar54 + 0x38 + lVar74);
      puVar8 = (undefined4 *)(lVar40 + uVar72 * 4);
      fVar172 = fVar172 - fVar80;
      lVar41 = *(long *)&pRVar34[*(uint *)(uVar54 + 0x4c + lVar74)].ptr[2].numPrimitives;
      lVar55 = *(long *)(lVar41 + lVar75);
      uVar69 = (ulong)*(uint *)(uVar54 + 0xc + lVar74);
      pfVar9 = (float *)(lVar55 + uVar69 * 4);
      uVar76 = (ulong)*(uint *)(uVar54 + 0x1c + lVar74);
      lVar40 = lVar55 + uVar76 * 4;
      uVar77 = (ulong)*(uint *)(uVar54 + 0x2c + lVar74);
      lVar75 = lVar55 + uVar77 * 4;
      uVar59 = *(uint *)(uVar54 + 0x3c + lVar74);
      puVar10 = (undefined4 *)(lVar55 + (ulong)uVar59 * 4);
      lVar55 = (long)((int)fVar80 + 1) * 0x38;
      pSVar60 = *(Scene **)(*(long *)&pGVar35[2].numPrimitives + lVar55);
      pfVar11 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                                 _vptr_RefCount + (ulong)*(uint *)(uVar54 + lVar74) * 4);
      lVar39 = *(long *)(lVar39 + lVar55);
      pfVar12 = (float *)(lVar39 + uVar65 * 4);
      local_f88 = CONCAT44(pfVar5[2],pfVar2[2]);
      stack[0].ptr.ptr._4_4_ = puVar10[2];
      stack[0].ptr.ptr._0_4_ = puVar8[2];
      local_1248 = (undefined1 (*) [16])CONCAT44(*puVar10,*puVar8);
      lVar37 = *(long *)(lVar37 + lVar55);
      pfVar13 = (float *)(lVar37 + uVar68 * 4);
      lVar41 = *(long *)(lVar41 + lVar55);
      pfVar14 = (float *)(lVar41 + uVar69 * 4);
      pfVar15 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                                 _vptr_RefCount + uVar57 * 4);
      pfVar16 = (float *)(lVar39 + uVar70 * 4);
      pfVar17 = (float *)(lVar37 + uVar62 * 4);
      pfVar18 = (float *)(lVar41 + uVar76 * 4);
      pfVar19 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                                 _vptr_RefCount + uVar58 * 4);
      pfVar20 = (float *)(lVar39 + uVar71 * 4);
      pfVar21 = (float *)(lVar37 + uVar63 * 4);
      pfVar22 = (float *)(lVar41 + uVar77 * 4);
      pfVar23 = (float *)((long)&(pSVar60->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                                 _vptr_RefCount + uVar61 * 4);
      pfVar24 = (float *)(lVar39 + uVar72 * 4);
      pfVar25 = (float *)(lVar37 + uVar64 * 4);
      pfVar26 = (float *)(lVar41 + (ulong)uVar59 * 4);
      fVar80 = 1.0 - fVar172;
      fVar106 = *pfVar27 * fVar80 + *pfVar11 * fVar172;
      fVar124 = *pfVar3 * fVar80 + *pfVar13 * fVar172;
      fVar131 = *pfVar6 * fVar80 + *pfVar12 * fVar172;
      fVar138 = *pfVar9 * fVar80 + *pfVar14 * fVar172;
      fVar107 = pfVar27[1] * fVar80 + pfVar11[1] * fVar172;
      fVar125 = pfVar3[1] * fVar80 + pfVar13[1] * fVar172;
      fVar132 = pfVar6[1] * fVar80 + pfVar12[1] * fVar172;
      fVar139 = pfVar9[1] * fVar80 + pfVar14[1] * fVar172;
      fVar108 = pfVar27[2] * fVar80 + pfVar11[2] * fVar172;
      fVar126 = pfVar3[2] * fVar80 + pfVar13[2] * fVar172;
      fVar133 = pfVar6[2] * fVar80 + pfVar12[2] * fVar172;
      fVar140 = pfVar9[2] * fVar80 + pfVar14[2] * fVar172;
      fVar109 = *(float *)(lVar7 + 8) * fVar80 + *pfVar15 * fVar172;
      fVar127 = *(float *)(lVar75 + 8) * fVar80 + *pfVar17 * fVar172;
      fVar134 = (float)uStack_1320 * fVar80 + *pfVar16 * fVar172;
      fVar141 = uStack_1320._4_4_ * fVar80 + *pfVar18 * fVar172;
      fVar110 = *(float *)(lVar1 + 4) * fVar80 + pfVar15[1] * fVar172;
      fVar128 = *(float *)(lVar36 + 4) * fVar80 + pfVar17[1] * fVar172;
      fVar135 = *(float *)(lVar38 + 4) * fVar80 + pfVar16[1] * fVar172;
      fVar142 = *(float *)(lVar40 + 4) * fVar80 + pfVar18[1] * fVar172;
      local_1298._0_4_ = *(float *)(lVar1 + 8) * fVar80 + pfVar15[2] * fVar172;
      local_1298._4_4_ = *(float *)(lVar36 + 8) * fVar80 + pfVar17[2] * fVar172;
      uStack_1290._0_4_ = *(float *)(lVar38 + 8) * fVar80 + pfVar16[2] * fVar172;
      uStack_1290._4_4_ = *(float *)(lVar40 + 8) * fVar80 + pfVar18[2] * fVar172;
      fVar146 = *pfVar28 * fVar80 + *pfVar19 * fVar172;
      fVar157 = *pfVar4 * fVar80 + *pfVar21 * fVar172;
      fVar162 = fStack_12d0 * fVar80 + *pfVar20 * fVar172;
      fVar167 = fStack_12cc * fVar80 + *pfVar22 * fVar172;
      fVar147 = pfVar28[1] * fVar80 + pfVar19[1] * fVar172;
      fVar158 = pfVar4[1] * fVar80 + pfVar21[1] * fVar172;
      fVar163 = *(float *)(lVar7 + 4) * fVar80 + pfVar20[1] * fVar172;
      fVar168 = *(float *)(lVar75 + 4) * fVar80 + pfVar22[1] * fVar172;
      fVar148 = pfVar28[2] * fVar80 + pfVar19[2] * fVar172;
      fVar159 = pfVar4[2] * fVar80 + pfVar21[2] * fVar172;
      fVar164 = fStack_1330 * fVar80 + pfVar20[2] * fVar172;
      fVar169 = fStack_132c * fVar80 + pfVar22[2] * fVar172;
      fVar149 = *pfVar2 * fVar80 + *pfVar23 * fVar172;
      fVar160 = *pfVar5 * fVar80 + *pfVar25 * fVar172;
      fVar165 = fStack_1250 * fVar80 + *pfVar24 * fVar172;
      fVar170 = fStack_124c * fVar80 + *pfVar26 * fVar172;
      fVar185 = pfVar2[1] * fVar80 + pfVar23[1] * fVar172;
      fVar191 = pfVar5[1] * fVar80 + pfVar25[1] * fVar172;
      fVar192 = (float)puVar8[1] * fVar80 + pfVar24[1] * fVar172;
      fVar193 = (float)puVar10[1] * fVar80 + pfVar26[1] * fVar172;
      fVar81 = fVar80 * pfVar2[2] + fVar172 * pfVar23[2];
      fVar101 = fVar80 * pfVar5[2] + fVar172 * pfVar25[2];
      fVar103 = fVar80 * fStack_f80 + fVar172 * pfVar24[2];
      fVar105 = fVar80 * fStack_f7c + fVar172 * pfVar26[2];
      fVar220 = fVar107 - fVar110;
      fVar222 = fVar125 - fVar128;
      fVar224 = fVar132 - fVar135;
      fVar226 = fVar139 - fVar142;
      fVar216 = fVar108 - (float)local_1298._0_4_;
      fVar217 = fVar126 - (float)local_1298._4_4_;
      fVar218 = fVar133 - (float)uStack_1290;
      fVar219 = fVar140 - uStack_1290._4_4_;
      fVar228 = fVar185 - fVar107;
      fVar230 = fVar191 - fVar125;
      fVar232 = fVar192 - fVar132;
      fVar234 = fVar193 - fVar139;
      fVar236 = fVar81 - fVar108;
      fVar237 = fVar101 - fVar126;
      fVar239 = fVar103 - fVar133;
      fVar241 = fVar105 - fVar140;
      fVar200 = fVar216 * fVar228 - fVar220 * fVar236;
      fVar203 = fVar217 * fVar230 - fVar222 * fVar237;
      fVar204 = fVar218 * fVar232 - fVar224 * fVar239;
      fVar205 = fVar219 * fVar234 - fVar226 * fVar241;
      fVar211 = fVar149 - fVar106;
      fVar213 = fVar160 - fVar124;
      fVar214 = fVar165 - fVar131;
      fVar215 = fVar170 - fVar138;
      fStack_12a4 = *(float *)(ray + k * 4);
      fStack_12b0 = *(float *)(ray + k * 4 + 0x10);
      fVar80 = *(float *)(ray + k * 4 + 0x40);
      auVar176._4_4_ = fVar80;
      auVar176._0_4_ = fVar80;
      auVar176._8_4_ = fVar80;
      auVar176._12_4_ = fVar80;
      fVar145 = *(float *)(ray + k * 4 + 0x50);
      fVar206 = fVar106 - fStack_12a4;
      fVar208 = fVar124 - fStack_12a4;
      fVar209 = fVar131 - fStack_12a4;
      fVar210 = fVar138 - fStack_12a4;
      fVar107 = fVar107 - fStack_12b0;
      fVar125 = fVar125 - fStack_12b0;
      fVar132 = fVar132 - fStack_12b0;
      fVar139 = fVar139 - fStack_12b0;
      fVar150 = fVar206 * fVar145 - fVar107 * fVar80;
      fVar161 = fVar208 * fVar145 - fVar125 * fVar80;
      fVar166 = fVar209 * fVar145 - fVar132 * fVar80;
      fVar171 = fVar210 * fVar145 - fVar139 * fVar80;
      fVar106 = fVar106 - fVar109;
      fVar124 = fVar124 - fVar127;
      fVar131 = fVar131 - fVar134;
      fVar138 = fVar138 - fVar141;
      fVar111 = fVar106 * fVar236 - fVar216 * fVar211;
      fVar129 = fVar124 * fVar237 - fVar217 * fVar213;
      fVar136 = fVar131 * fVar239 - fVar218 * fVar214;
      fVar143 = fVar138 * fVar241 - fVar219 * fVar215;
      fStack_1234 = *(float *)(ray + k * 4 + 0x20);
      fVar172 = *(float *)(ray + k * 4 + 0x60);
      fVar108 = fVar108 - fStack_1234;
      fVar126 = fVar126 - fStack_1234;
      fVar133 = fVar133 - fStack_1234;
      fVar140 = fVar140 - fStack_1234;
      fVar112 = fVar108 * fVar80 - fVar206 * fVar172;
      fVar130 = fVar126 * fVar80 - fVar208 * fVar172;
      fVar137 = fVar133 * fVar80 - fVar209 * fVar172;
      fVar144 = fVar140 * fVar80 - fVar210 * fVar172;
      fVar221 = fVar220 * fVar211 - fVar106 * fVar228;
      fVar223 = fVar222 * fVar213 - fVar124 * fVar230;
      fVar225 = fVar224 * fVar214 - fVar131 * fVar232;
      fVar227 = fVar226 * fVar215 - fVar138 * fVar234;
      fVar243 = fVar107 * fVar172 - fVar108 * fVar145;
      fVar244 = fVar125 * fVar172 - fVar126 * fVar145;
      fVar245 = fVar132 * fVar172 - fVar133 * fVar145;
      fVar246 = fVar139 * fVar172 - fVar140 * fVar145;
      fVar82 = fVar200 * fVar80 + fVar111 * fVar145 + fVar221 * fVar172;
      fVar102 = fVar203 * fVar80 + fVar129 * fVar145 + fVar223 * fVar172;
      fVar104 = fVar204 * fVar80 + fVar136 * fVar145 + fVar225 * fVar172;
      fVar80 = fVar205 * fVar80 + fVar143 * fVar145 + fVar227 * fVar172;
      uVar229 = (uint)fVar82 & 0x80000000;
      uVar231 = (uint)fVar102 & 0x80000000;
      uVar233 = (uint)fVar104 & 0x80000000;
      uVar235 = (uint)fVar80 & 0x80000000;
      tNear.field_0.i[0] =
           (uint)(fVar211 * fVar243 + fVar228 * fVar112 + fVar236 * fVar150) ^ uVar229;
      tNear.field_0.i[1] =
           (uint)(fVar213 * fVar244 + fVar230 * fVar130 + fVar237 * fVar161) ^ uVar231;
      tNear.field_0.i[2] =
           (uint)(fVar214 * fVar245 + fVar232 * fVar137 + fVar239 * fVar166) ^ uVar233;
      tNear.field_0.i[3] =
           (uint)(fVar215 * fVar246 + fVar234 * fVar144 + fVar241 * fVar171) ^ uVar235;
      fVar150 = (float)((uint)(fVar243 * fVar106 + fVar112 * fVar220 + fVar150 * fVar216) ^ uVar229)
      ;
      fVar161 = (float)((uint)(fVar244 * fVar124 + fVar130 * fVar222 + fVar161 * fVar217) ^ uVar231)
      ;
      fVar131 = (float)((uint)(fVar245 * fVar131 + fVar137 * fVar224 + fVar166 * fVar218) ^ uVar233)
      ;
      fVar137 = (float)((uint)(fVar246 * fVar138 + fVar144 * fVar226 + fVar171 * fVar219) ^ uVar235)
      ;
      fVar106 = ABS(fVar82);
      fVar112 = ABS(fVar102);
      fVar124 = ABS(fVar104);
      fVar130 = ABS(fVar80);
      bVar45 = ((0.0 <= tNear.field_0.v[0] && 0.0 <= fVar150) && fVar82 != 0.0) &&
               tNear.field_0.v[0] + fVar150 <= fVar106;
      auVar155._0_4_ = -(uint)bVar45;
      bVar46 = ((0.0 <= tNear.field_0.v[1] && 0.0 <= fVar161) && fVar102 != 0.0) &&
               tNear.field_0.v[1] + fVar161 <= fVar112;
      auVar155._4_4_ = -(uint)bVar46;
      bVar44 = ((0.0 <= tNear.field_0.v[2] && 0.0 <= fVar131) && fVar104 != 0.0) &&
               tNear.field_0.v[2] + fVar131 <= fVar124;
      auVar155._8_4_ = -(uint)bVar44;
      bVar43 = ((0.0 <= tNear.field_0.v[3] && 0.0 <= fVar137) && fVar80 != 0.0) &&
               tNear.field_0.v[3] + fVar137 <= fVar130;
      auVar155._12_4_ = -(uint)bVar43;
      lVar74 = uVar54 + lVar74;
      iVar51 = movmskps(uVar59,auVar155);
      local_12b8._4_4_ = fStack_12b0;
      if (iVar51 == 0) {
        uVar59 = 0;
      }
      else {
        fVar82 = (float)(uVar229 ^ (uint)(fVar206 * fVar200 + fVar107 * fVar111 + fVar108 * fVar221)
                        );
        fVar102 = (float)(uVar231 ^
                         (uint)(fVar208 * fVar203 + fVar125 * fVar129 + fVar126 * fVar223));
        fVar104 = (float)(uVar233 ^
                         (uint)(fVar209 * fVar204 + fVar132 * fVar136 + fVar133 * fVar225));
        fVar107 = (float)(uVar235 ^
                         (uint)(fVar210 * fVar205 + fVar139 * fVar143 + fVar140 * fVar227));
        fVar80 = *(float *)(ray + k * 4 + 0x30);
        local_1378._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
        bVar45 = (fVar80 * fVar106 < fVar82 && fVar82 <= (float)local_1378._0_4_ * fVar106) &&
                 bVar45;
        bVar46 = (fVar80 * fVar112 < fVar102 && fVar102 <= (float)local_1378._0_4_ * fVar112) &&
                 bVar46;
        valid.field_0._0_8_ = CONCAT44(-(uint)bVar46,-(uint)bVar45);
        bVar44 = (fVar80 * fVar124 < fVar104 && fVar104 <= (float)local_1378._0_4_ * fVar124) &&
                 bVar44;
        valid.field_0.i[2] = -(uint)bVar44;
        bVar43 = (fVar80 * fVar130 < fVar107 && fVar107 <= (float)local_1378._0_4_ * fVar130) &&
                 bVar43;
        valid.field_0.i[3] = -(uint)bVar43;
        uVar59 = movmskps(iVar51,(undefined1  [16])valid.field_0);
        if (uVar59 != 0) {
          local_1378._4_4_ = 0;
          local_1378._8_4_ = 0;
          local_1378._12_4_ = 0;
          local_10b8._8_8_ = uStack_fa0;
          local_10b8._0_8_ = local_fa8;
          auVar47._4_4_ = fVar112;
          auVar47._0_4_ = fVar106;
          auVar47._8_4_ = fVar124;
          auVar47._12_4_ = fVar130;
          auVar181 = rcpps(auVar176,auVar47);
          fVar80 = auVar181._0_4_;
          fVar145 = auVar181._4_4_;
          fVar108 = auVar181._8_4_;
          fVar125 = auVar181._12_4_;
          fVar126 = (float)DAT_01f46a60;
          fVar132 = DAT_01f46a60._4_4_;
          fVar133 = DAT_01f46a60._12_4_;
          fVar172 = DAT_01f46a60._8_4_;
          fVar80 = (fVar126 - fVar106 * fVar80) * fVar80 + fVar80;
          fVar145 = (fVar132 - fVar112 * fVar145) * fVar145 + fVar145;
          fVar108 = (fVar172 - fVar124 * fVar108) * fVar108 + fVar108;
          fVar125 = (fVar133 - fVar130 * fVar125) * fVar125 + fVar125;
          fVar82 = fVar82 * fVar80;
          fVar102 = fVar102 * fVar145;
          fVar104 = fVar104 * fVar108;
          fVar107 = fVar107 * fVar125;
          local_10f8._4_4_ = fVar102;
          local_10f8._0_4_ = fVar82;
          fStack_10f0 = fVar104;
          fStack_10ec = fVar107;
          auVar212._0_4_ = tNear.field_0.v[0] * fVar80;
          auVar212._4_4_ = tNear.field_0.v[1] * fVar145;
          auVar212._8_4_ = tNear.field_0.v[2] * fVar108;
          auVar212._12_4_ = tNear.field_0.v[3] * fVar125;
          auVar151 = minps(auVar212,_DAT_01f46a60);
          auVar156._0_4_ = fVar80 * fVar150;
          auVar156._4_4_ = fVar145 * fVar161;
          auVar156._8_4_ = fVar108 * fVar131;
          auVar156._12_4_ = fVar125 * fVar137;
          auVar181 = minps(auVar156,_DAT_01f46a60);
          auVar178._0_4_ = fVar126 - auVar151._0_4_;
          auVar178._4_4_ = fVar132 - auVar151._4_4_;
          auVar178._8_4_ = fVar172 - auVar151._8_4_;
          auVar178._12_4_ = fVar133 - auVar151._12_4_;
          auVar189._0_4_ = fVar126 - auVar181._0_4_;
          auVar189._4_4_ = fVar132 - auVar181._4_4_;
          auVar189._8_4_ = fVar172 - auVar181._8_4_;
          auVar189._12_4_ = fVar133 - auVar181._12_4_;
          local_1118 = blendvps(auVar151,auVar178,local_10b8);
          local_1108 = blendvps(auVar181,auVar189,local_10b8);
          local_10e8 = CONCAT44(fVar203,fVar200);
          uStack_10e0 = CONCAT44(fVar205,fVar204);
          local_10d8 = CONCAT44(fVar129,fVar111);
          uStack_10d0 = CONCAT44(fVar143,fVar136);
          local_10c8 = CONCAT44(fVar223,fVar221);
          uStack_10c0 = CONCAT44(fVar227,fVar225);
          auVar92._8_4_ = valid.field_0.i[2];
          auVar92._0_8_ = valid.field_0._0_8_;
          auVar92._12_4_ = valid.field_0.i[3];
          auVar48._4_4_ = fVar102;
          auVar48._0_4_ = fVar82;
          auVar48._8_4_ = fVar104;
          auVar48._12_4_ = fVar107;
          auVar151 = blendvps(_DAT_01f45a30,auVar48,auVar92);
          auVar179._4_4_ = auVar151._0_4_;
          auVar179._0_4_ = auVar151._4_4_;
          auVar179._8_4_ = auVar151._12_4_;
          auVar179._12_4_ = auVar151._8_4_;
          auVar181 = minps(auVar179,auVar151);
          auVar93._0_8_ = auVar181._8_8_;
          auVar93._8_4_ = auVar181._0_4_;
          auVar93._12_4_ = auVar181._4_4_;
          auVar181 = minps(auVar93,auVar181);
          auVar94._0_8_ =
               CONCAT44(-(uint)(auVar181._4_4_ == auVar151._4_4_ && bVar46),
                        -(uint)(auVar181._0_4_ == auVar151._0_4_ && bVar45));
          auVar94._8_4_ = -(uint)(auVar181._8_4_ == auVar151._8_4_ && bVar44);
          auVar94._12_4_ = -(uint)(auVar181._12_4_ == auVar151._12_4_ && bVar43);
          iVar51 = movmskps(uVar59,auVar94);
          aVar114 = valid.field_0;
          if (iVar51 != 0) {
            aVar114.i[2] = auVar94._8_4_;
            aVar114._0_8_ = auVar94._0_8_;
            aVar114.i[3] = auVar94._12_4_;
          }
          uVar59 = movmskps(iVar51,(undefined1  [16])aVar114);
          local_12b8 = (Scene *)0x0;
          fStack_12ac = fStack_12b0;
          if (uVar59 != 0) {
            for (; (uVar59 >> (long)local_12b8 & 1) == 0;
                local_12b8 = (Scene *)((long)&(local_12b8->super_AccelN).super_Accel.super_AccelData
                                              .super_RefCount._vptr_RefCount + 1)) {
            }
          }
LAB_0071b28c:
          uVar59 = *(uint *)(lVar74 + 0x40 + (long)local_12b8 * 4);
          pGVar35 = (pSVar33->geometries).items[uVar59].ptr;
          if ((pGVar35->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[(long)local_12b8] = 0.0;
            local_12b8 = pSVar33;
LAB_0071b5c3:
            uVar59 = movmskps((int)local_12b8,(undefined1  [16])valid.field_0);
            pSVar60 = pSVar33;
            if (uVar59 == 0) goto LAB_0071bd5c;
            auVar49._4_4_ = fVar102;
            auVar49._0_4_ = fVar82;
            auVar49._8_4_ = fVar104;
            auVar49._12_4_ = fVar107;
            auVar151 = blendvps(_DAT_01f45a30,auVar49,(undefined1  [16])valid.field_0);
            auVar180._4_4_ = auVar151._0_4_;
            auVar180._0_4_ = auVar151._4_4_;
            auVar180._8_4_ = auVar151._12_4_;
            auVar180._12_4_ = auVar151._8_4_;
            auVar181 = minps(auVar180,auVar151);
            auVar116._0_8_ = auVar181._8_8_;
            auVar116._8_4_ = auVar181._0_4_;
            auVar116._12_4_ = auVar181._4_4_;
            auVar181 = minps(auVar116,auVar181);
            auVar117._0_8_ =
                 CONCAT44(-(uint)(auVar181._4_4_ == auVar151._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar181._0_4_ == auVar151._0_4_) & valid.field_0._0_4_);
            auVar117._8_4_ = -(uint)(auVar181._8_4_ == auVar151._8_4_) & valid.field_0._8_4_;
            auVar117._12_4_ = -(uint)(auVar181._12_4_ == auVar151._12_4_) & valid.field_0._12_4_;
            iVar51 = movmskps(uVar59,auVar117);
            aVar96 = valid.field_0;
            if (iVar51 != 0) {
              aVar96.i[2] = auVar117._8_4_;
              aVar96._0_8_ = auVar117._0_8_;
              aVar96.i[3] = auVar117._12_4_;
            }
            uVar53 = movmskps(iVar51,(undefined1  [16])aVar96);
            uVar57 = CONCAT44((int)((ulong)local_12b8 >> 0x20),uVar53);
            local_12b8 = (Scene *)0x0;
            if (uVar57 != 0) {
              for (; (uVar57 >> (long)local_12b8 & 1) == 0;
                  local_12b8 = (Scene *)((long)&(local_12b8->super_AccelN).super_Accel.
                                                super_AccelData.super_RefCount._vptr_RefCount + 1))
              {
              }
            }
            goto LAB_0071b28c;
          }
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar35->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            _local_12a8 = CONCAT44(fVar102,fVar82);
            local_1018 = *(undefined4 *)(local_1118 + (long)local_12b8 * 4);
            local_1008 = *(undefined4 *)(local_1108 + (long)local_12b8 * 4);
            local_1048._4_4_ = *(undefined4 *)((long)&local_10e8 + (long)local_12b8 * 4);
            local_1038._4_4_ = *(undefined4 *)((long)&local_10d8 + (long)local_12b8 * 4);
            local_fe8._4_4_ = uVar59;
            local_fe8._0_4_ = uVar59;
            local_fe8._8_4_ = uVar59;
            local_fe8._12_4_ = uVar59;
            local_ff8._4_4_ = *(undefined4 *)(lVar74 + 0x50 + (long)local_12b8 * 4);
            local_1028._4_4_ = *(undefined4 *)((long)&local_10c8 + (long)local_12b8 * 4);
            local_1048._0_4_ = local_1048._4_4_;
            local_1048._8_4_ = local_1048._4_4_;
            local_1048._12_4_ = local_1048._4_4_;
            local_1038._0_4_ = local_1038._4_4_;
            local_1038._8_4_ = local_1038._4_4_;
            local_1038._12_4_ = local_1038._4_4_;
            local_1028._0_4_ = local_1028._4_4_;
            local_1028._8_4_ = local_1028._4_4_;
            local_1028._12_4_ = local_1028._4_4_;
            uStack_1014 = local_1018;
            uStack_1010 = local_1018;
            uStack_100c = local_1018;
            uStack_1004 = local_1008;
            uStack_1000 = local_1008;
            uStack_ffc = local_1008;
            local_ff8._0_4_ = local_ff8._4_4_;
            local_ff8._8_4_ = local_ff8._4_4_;
            local_ff8._12_4_ = local_ff8._4_4_;
            local_fd8 = context->user->instID[0];
            uStack_fd4 = local_fd8;
            uStack_fd0 = local_fd8;
            uStack_fcc = local_fd8;
            local_fc8 = context->user->instPrimID[0];
            uStack_fc4 = local_fc8;
            uStack_fc0 = local_fc8;
            uStack_fbc = local_fc8;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10f8 + (long)local_12b8 * 4)
            ;
            local_12c8 = *local_1248;
            args.valid = (int *)local_12c8;
            args.geometryUserPtr = pGVar35->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1048;
            args.N = 4;
            fStack_12a0 = fVar104;
            fStack_129c = fVar107;
            args.ray = (RTCRayN *)ray;
            if (pGVar35->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar35->intersectionFilterN)(&args);
            }
            if (local_12c8 == (undefined1  [16])0x0) {
              auVar115._8_4_ = 0xffffffff;
              auVar115._0_8_ = 0xffffffffffffffff;
              auVar115._12_4_ = 0xffffffff;
              auVar115 = auVar115 ^ _DAT_01f46b70;
            }
            else {
              p_Var42 = context->args->filter;
              if ((p_Var42 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar35->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var42)(&args);
              }
              auVar95._0_4_ = -(uint)(local_12c8._0_4_ == 0);
              auVar95._4_4_ = -(uint)(local_12c8._4_4_ == 0);
              auVar95._8_4_ = -(uint)(local_12c8._8_4_ == 0);
              auVar95._12_4_ = -(uint)(local_12c8._12_4_ == 0);
              auVar115 = auVar95 ^ _DAT_01f46b70;
              if (local_12c8 != (undefined1  [16])0x0) {
                auVar181 = blendvps(*(undefined1 (*) [16])args.hit,
                                    *(undefined1 (*) [16])(args.ray + 0xc0),auVar95);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                    *(undefined1 (*) [16])(args.ray + 0xd0),auVar95);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                    *(undefined1 (*) [16])(args.ray + 0xe0),auVar95);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                    *(undefined1 (*) [16])(args.ray + 0xf0),auVar95);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                    *(undefined1 (*) [16])(args.ray + 0x100),auVar95);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                    *(undefined1 (*) [16])(args.ray + 0x110),auVar95);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                    *(undefined1 (*) [16])(args.ray + 0x120),auVar95);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                    *(undefined1 (*) [16])(args.ray + 0x130),auVar95);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                    *(undefined1 (*) [16])(args.ray + 0x140),auVar95);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar181;
              }
            }
            if ((_DAT_01f46b40 & auVar115) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1378._0_4_;
            }
            else {
              local_1378 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            valid.field_0.v[(long)local_12b8] = 0.0;
            valid.field_0.i[0] = -(uint)(local_12a8 <= (float)local_1378._0_4_) & valid.field_0.i[0]
            ;
            valid.field_0.i[1] =
                 -(uint)(fStack_12a4 <= (float)local_1378._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] =
                 -(uint)(fStack_12a0 <= (float)local_1378._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] =
                 -(uint)(fStack_129c <= (float)local_1378._0_4_) & valid.field_0.i[3];
            fVar82 = local_12a8;
            fVar102 = fStack_12a4;
            fVar104 = fStack_12a0;
            fVar107 = fStack_129c;
            goto LAB_0071b5c3;
          }
          uVar53 = *(undefined4 *)(local_1118 + (long)local_12b8 * 4);
          uVar29 = *(undefined4 *)(local_1108 + (long)local_12b8 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10f8 + (long)local_12b8 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) =
               *(undefined4 *)((long)&local_10e8 + (long)local_12b8 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) =
               *(undefined4 *)((long)&local_10d8 + (long)local_12b8 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) =
               *(undefined4 *)((long)&local_10c8 + (long)local_12b8 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar53;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar29;
          *(undefined4 *)(ray + k * 4 + 0x110) =
               *(undefined4 *)(lVar74 + 0x50 + (long)local_12b8 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar59;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar59 = context->user->instPrimID[0];
          *(uint *)(ray + k * 4 + 0x140) = uVar59;
          pSVar60 = (Scene *)context;
LAB_0071bd5c:
          fStack_12a4 = *(float *)(ray + k * 4);
          local_12b8._4_4_ = *(float *)(ray + k * 4 + 0x10);
          fStack_1234 = *(float *)(ray + k * 4 + 0x20);
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar176._4_4_ = uVar53;
          auVar176._0_4_ = uVar53;
          auVar176._8_4_ = uVar53;
          auVar176._12_4_ = uVar53;
          fVar145 = *(float *)(ray + k * 4 + 0x50);
          fVar172 = *(float *)(ray + k * 4 + 0x60);
        }
      }
      fVar149 = fVar146 - fVar149;
      fVar160 = fVar157 - fVar160;
      fVar165 = fVar162 - fVar165;
      fVar170 = fVar167 - fVar170;
      fVar185 = fVar147 - fVar185;
      fVar191 = fVar158 - fVar191;
      fStack_1250 = fVar163 - fVar192;
      fStack_124c = fVar168 - fVar193;
      fVar81 = fVar148 - fVar81;
      fVar101 = fVar159 - fVar101;
      fVar103 = fVar164 - fVar103;
      fVar105 = fVar169 - fVar105;
      fVar109 = fVar109 - fVar146;
      fVar127 = fVar127 - fVar157;
      fVar134 = fVar134 - fVar162;
      fVar141 = fVar141 - fVar167;
      fVar110 = fVar110 - fVar147;
      fVar128 = fVar128 - fVar158;
      fVar135 = fVar135 - fVar163;
      fVar142 = fVar142 - fVar168;
      fVar112 = auVar176._0_4_;
      fVar125 = auVar176._4_4_;
      fVar129 = auVar176._8_4_;
      fVar131 = auVar176._12_4_;
      fVar124 = (float)local_1298._0_4_ - fVar148;
      fVar126 = (float)local_1298._4_4_ - fVar159;
      fVar130 = (float)uStack_1290 - fVar164;
      fVar132 = uStack_1290._4_4_ - fVar169;
      local_1328._0_4_ = fVar110 * fVar81 - fVar124 * fVar185;
      local_1328._4_4_ = fVar128 * fVar101 - fVar126 * fVar191;
      uStack_1320._0_4_ = fVar135 * fVar103 - fVar130 * fStack_1250;
      uStack_1320._4_4_ = fVar142 * fVar105 - fVar132 * fStack_124c;
      fVar143 = fVar124 * fVar149 - fVar109 * fVar81;
      fVar144 = fVar126 * fVar160 - fVar127 * fVar101;
      fStack_1330 = fVar130 * fVar165 - fVar134 * fVar103;
      fStack_132c = fVar132 * fVar170 - fVar141 * fVar105;
      fVar133 = fVar109 * fVar185 - fVar110 * fVar149;
      fVar136 = fVar127 * fVar191 - fVar128 * fVar160;
      local_1298 = (undefined1  [8])CONCAT44(fVar136,fVar133);
      uStack_1290._0_4_ = fVar134 * fStack_1250 - fVar135 * fVar165;
      uStack_1290._4_4_ = fVar141 * fStack_124c - fVar142 * fVar170;
      fVar146 = fVar146 - fStack_12a4;
      fVar157 = fVar157 - fStack_12a4;
      fStack_12d0 = fVar162 - fStack_12a4;
      fStack_12cc = fVar167 - fStack_12a4;
      fVar147 = fVar147 - local_12b8._4_4_;
      fVar158 = fVar158 - local_12b8._4_4_;
      fVar163 = fVar163 - local_12b8._4_4_;
      fVar168 = fVar168 - local_12b8._4_4_;
      fVar148 = fVar148 - fStack_1234;
      fVar159 = fVar159 - fStack_1234;
      fVar164 = fVar164 - fStack_1234;
      fVar169 = fVar169 - fStack_1234;
      fVar106 = fVar147 * fVar172 - fVar148 * fVar145;
      fVar107 = fVar158 * fVar172 - fVar159 * fVar145;
      fVar108 = fVar163 * fVar172 - fVar164 * fVar145;
      fVar111 = fVar168 * fVar172 - fVar169 * fVar145;
      fVar137 = fVar148 * fVar112 - fVar146 * fVar172;
      fVar138 = fVar159 * fVar125 - fVar157 * fVar172;
      fVar139 = fVar164 * fVar129 - fStack_12d0 * fVar172;
      fVar140 = fVar169 * fVar131 - fStack_12cc * fVar172;
      fVar80 = fVar146 * fVar145 - fVar147 * fVar112;
      fVar82 = fVar157 * fVar145 - fVar158 * fVar125;
      fVar102 = fStack_12d0 * fVar145 - fVar163 * fVar129;
      fVar104 = fStack_12cc * fVar145 - fVar168 * fVar131;
      local_1338 = CONCAT44(fVar144,fVar143);
      fVar112 = fVar112 * (float)local_1328._0_4_ + fVar145 * fVar143 + fVar172 * fVar133;
      fVar125 = fVar125 * (float)local_1328._4_4_ + fVar145 * fVar144 + fVar172 * fVar136;
      fVar150 = fVar129 * (float)uStack_1320 + fVar145 * fStack_1330 + fVar172 * (float)uStack_1290;
      fVar145 = fVar131 * uStack_1320._4_4_ + fVar145 * fStack_132c + fVar172 * uStack_1290._4_4_;
      uVar229 = (uint)fVar112 & 0x80000000;
      uVar231 = (uint)fVar125 & 0x80000000;
      uVar233 = (uint)fVar150 & 0x80000000;
      uVar235 = (uint)fVar145 & 0x80000000;
      tNear.field_0.i[0] =
           (uint)(fVar109 * fVar106 + fVar110 * fVar137 + fVar124 * fVar80) ^ uVar229;
      tNear.field_0.i[1] =
           (uint)(fVar127 * fVar107 + fVar128 * fVar138 + fVar126 * fVar82) ^ uVar231;
      tNear.field_0.i[2] =
           (uint)(fVar134 * fVar108 + fVar135 * fVar139 + fVar130 * fVar102) ^ uVar233;
      tNear.field_0.i[3] =
           (uint)(fVar141 * fVar111 + fVar142 * fVar140 + fVar132 * fVar104) ^ uVar235;
      fVar127 = (float)((uint)(fVar106 * fVar149 + fVar137 * fVar185 + fVar80 * fVar81) ^ uVar229);
      fVar128 = (float)((uint)(fVar107 * fVar160 + fVar138 * fVar191 + fVar82 * fVar101) ^ uVar231);
      fVar129 = (float)((uint)(fVar108 * fVar165 + fVar139 * fStack_1250 + fVar102 * fVar103) ^
                       uVar233);
      fVar130 = (float)((uint)(fVar111 * fVar170 + fVar140 * fStack_124c + fVar104 * fVar105) ^
                       uVar235);
      fVar80 = ABS(fVar112);
      fVar126 = ABS(fVar125);
      auVar113._0_8_ = CONCAT44(fVar125,fVar112) & 0x7fffffff7fffffff;
      auVar113._8_4_ = ABS(fVar150);
      auVar113._12_4_ = ABS(fVar145);
      bVar45 = tNear.field_0.v[0] + fVar127 <= fVar80 &&
               ((0.0 <= tNear.field_0.v[0] && 0.0 <= fVar127) && fVar112 != 0.0);
      auVar177._0_4_ = -(uint)bVar45;
      bVar46 = tNear.field_0.v[1] + fVar128 <= fVar126 &&
               ((0.0 <= tNear.field_0.v[1] && 0.0 <= fVar128) && fVar125 != 0.0);
      auVar177._4_4_ = -(uint)bVar46;
      bVar44 = tNear.field_0.v[2] + fVar129 <= auVar113._8_4_ &&
               ((0.0 <= tNear.field_0.v[2] && 0.0 <= fVar129) && fVar150 != 0.0);
      auVar177._8_4_ = -(uint)bVar44;
      bVar43 = tNear.field_0.v[3] + fVar130 <= auVar113._12_4_ &&
               ((0.0 <= tNear.field_0.v[3] && 0.0 <= fVar130) && fVar145 != 0.0);
      auVar177._12_4_ = -(uint)bVar43;
      iVar52 = movmskps(uVar59,auVar177);
      fVar145 = local_1058;
      fVar101 = fStack_1054;
      fVar102 = fStack_1050;
      fVar191 = fStack_104c;
      fVar172 = local_1068;
      fVar103 = fStack_1064;
      fVar104 = fStack_1060;
      fVar105 = fStack_105c;
      fVar81 = local_1078;
      fVar106 = fStack_1074;
      fVar107 = fStack_1070;
      fVar108 = fStack_106c;
      fVar82 = local_1088;
      fVar109 = fStack_1084;
      fVar110 = fStack_1080;
      fVar111 = fStack_107c;
      fVar185 = local_1098;
      fVar112 = fStack_1094;
      fVar124 = fStack_1090;
      fVar125 = fStack_108c;
      iVar51 = local_10a8;
      iVar238 = iStack_10a4;
      iVar240 = iStack_10a0;
      iVar242 = iStack_109c;
      if (iVar52 != 0) {
        fVar131 = (float)(uVar229 ^
                         (uint)(fVar146 * (float)local_1328._0_4_ +
                               fVar147 * fVar143 + fVar148 * fVar133));
        fVar157 = (float)(uVar231 ^
                         (uint)(fVar157 * (float)local_1328._4_4_ +
                               fVar158 * fVar144 + fVar159 * fVar136));
        fVar132 = (float)(uVar233 ^
                         (uint)(fStack_12d0 * (float)uStack_1320 +
                               fVar163 * fStack_1330 + fVar164 * (float)uStack_1290));
        fVar133 = (float)(uVar235 ^
                         (uint)(fStack_12cc * uStack_1320._4_4_ +
                               fVar168 * fStack_132c + fVar169 * uStack_1290._4_4_));
        fVar146 = *(float *)(ray + k * 4 + 0x30);
        local_1378._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1378._4_4_ = 0;
        local_1378._8_4_ = 0;
        local_1378._12_4_ = 0;
        bVar45 = (fVar131 <= (float)local_1378._0_4_ * fVar80 && fVar146 * fVar80 < fVar131) &&
                 bVar45;
        bVar46 = (fVar157 <= (float)local_1378._0_4_ * fVar126 && fVar146 * fVar126 < fVar157) &&
                 bVar46;
        auVar97._0_8_ = CONCAT44(-(uint)bVar46,-(uint)bVar45);
        bVar44 = (fVar132 <= (float)local_1378._0_4_ * auVar113._8_4_ &&
                 fVar146 * auVar113._8_4_ < fVar132) && bVar44;
        auVar97._8_4_ = -(uint)bVar44;
        bVar43 = (fVar133 <= (float)local_1378._0_4_ * auVar113._12_4_ &&
                 fVar146 * auVar113._12_4_ < fVar133) && bVar43;
        auVar97._12_4_ = -(uint)bVar43;
        iVar52 = movmskps(iVar52,auVar97);
        if (iVar52 != 0) {
          valid.field_0.i[2] = auVar97._8_4_;
          valid.field_0._0_8_ = auVar97._0_8_;
          valid.field_0.i[3] = auVar97._12_4_;
          local_10b8._8_8_ = uStack_fb0;
          local_10b8._0_8_ = local_fb8;
          pSVar60 = context->scene;
          auVar181 = rcpps(auVar177,auVar113);
          fVar146 = auVar181._0_4_;
          fVar134 = auVar181._4_4_;
          fVar135 = auVar181._8_4_;
          fVar136 = auVar181._12_4_;
          fVar138 = (float)DAT_01f46a60;
          fVar139 = DAT_01f46a60._4_4_;
          fVar140 = DAT_01f46a60._12_4_;
          fVar137 = DAT_01f46a60._8_4_;
          fVar146 = (fVar138 - fVar80 * fVar146) * fVar146 + fVar146;
          fVar134 = (fVar139 - fVar126 * fVar134) * fVar134 + fVar134;
          fVar135 = (fVar137 - auVar113._8_4_ * fVar135) * fVar135 + fVar135;
          fVar136 = (fVar140 - auVar113._12_4_ * fVar136) * fVar136 + fVar136;
          auVar207._0_4_ = fVar131 * fVar146;
          auVar207._4_4_ = fVar157 * fVar134;
          auVar207._8_4_ = fVar132 * fVar135;
          auVar207._12_4_ = fVar133 * fVar136;
          _local_10f8 = auVar207;
          auVar190._0_4_ = tNear.field_0.v[0] * fVar146;
          auVar190._4_4_ = tNear.field_0.v[1] * fVar134;
          auVar190._8_4_ = tNear.field_0.v[2] * fVar135;
          auVar190._12_4_ = tNear.field_0.v[3] * fVar136;
          auVar181 = minps(auVar190,_DAT_01f46a60);
          auVar199._0_4_ = fVar146 * fVar127;
          auVar199._4_4_ = fVar134 * fVar128;
          auVar199._8_4_ = fVar135 * fVar129;
          auVar199._12_4_ = fVar136 * fVar130;
          auVar151 = minps(auVar199,_DAT_01f46a60);
          auVar182._0_4_ = fVar138 - auVar181._0_4_;
          auVar182._4_4_ = fVar139 - auVar181._4_4_;
          auVar182._8_4_ = fVar137 - auVar181._8_4_;
          auVar182._12_4_ = fVar140 - auVar181._12_4_;
          auVar118._0_4_ = fVar138 - auVar151._0_4_;
          auVar118._4_4_ = fVar139 - auVar151._4_4_;
          auVar118._8_4_ = fVar137 - auVar151._8_4_;
          auVar118._12_4_ = fVar140 - auVar151._12_4_;
          local_1118 = blendvps(auVar181,auVar182,local_10b8);
          local_1108 = blendvps(auVar151,auVar118,local_10b8);
          local_10e8 = local_1328;
          uStack_10e0 = uStack_1320;
          local_10d8 = local_1338;
          uStack_10d0 = CONCAT44(fStack_132c,fStack_1330);
          local_10c8 = local_1298;
          uStack_10c0 = uStack_1290;
          auVar98._8_4_ = auVar97._8_4_;
          auVar98._0_8_ = auVar97._0_8_;
          auVar98._12_4_ = auVar97._12_4_;
          auVar151 = blendvps(_DAT_01f45a30,auVar207,auVar98);
          auVar183._4_4_ = auVar151._0_4_;
          auVar183._0_4_ = auVar151._4_4_;
          auVar183._8_4_ = auVar151._12_4_;
          auVar183._12_4_ = auVar151._8_4_;
          auVar181 = minps(auVar183,auVar151);
          auVar119._0_8_ = auVar181._8_8_;
          auVar119._8_4_ = auVar181._0_4_;
          auVar119._12_4_ = auVar181._4_4_;
          auVar181 = minps(auVar119,auVar181);
          auVar120._0_8_ =
               CONCAT44(-(uint)(auVar181._4_4_ == auVar151._4_4_ && bVar46),
                        -(uint)(auVar181._0_4_ == auVar151._0_4_ && bVar45));
          auVar120._8_4_ = -(uint)(auVar181._8_4_ == auVar151._8_4_ && bVar44);
          auVar120._12_4_ = -(uint)(auVar181._12_4_ == auVar151._12_4_ && bVar43);
          iVar52 = movmskps((int)context,auVar120);
          if (iVar52 != 0) {
            auVar98._8_4_ = auVar120._8_4_;
            auVar98._0_8_ = auVar120._0_8_;
            auVar98._12_4_ = auVar120._12_4_;
          }
          uVar53 = movmskps(iVar52,auVar98);
          uVar58 = CONCAT44((int)((ulong)context >> 0x20),uVar53);
          uVar57 = 0;
          fStack_12b0 = local_12b8._4_4_;
          fStack_12ac = local_12b8._4_4_;
          fStack_12a0 = fStack_12a4;
          fStack_129c = fStack_12a4;
          local_12a8 = fStack_12a4;
          local_12b8._0_4_ = local_12b8._4_4_;
          if (uVar58 != 0) {
            for (; (uVar58 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
            }
          }
LAB_0071b86a:
          uVar59 = *(uint *)(lVar74 + 0x40 + uVar57 * 4);
          uVar58 = (ulong)uVar59;
          pGVar35 = (pSVar60->geometries).items[uVar58].ptr;
          if ((pGVar35->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[uVar57] = 0.0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar35->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar53 = *(undefined4 *)(local_1118 + uVar57 * 4);
              uVar29 = *(undefined4 *)(local_1108 + uVar57 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10f8 + uVar57 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_10e8 + uVar57 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_10d8 + uVar57 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_10c8 + uVar57 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar53;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar29;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar74 + 0x50 + uVar57 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar59;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              pSVar60 = (Scene *)context;
              goto LAB_0071b0d4;
            }
            local_1018 = *(undefined4 *)(local_1118 + uVar57 * 4);
            local_1008 = *(undefined4 *)(local_1108 + uVar57 * 4);
            uVar53 = *(undefined4 *)((long)&local_10e8 + uVar57 * 4);
            uVar29 = *(undefined4 *)((long)&local_10d8 + uVar57 * 4);
            local_fe8._4_4_ = uVar59;
            local_fe8._0_4_ = uVar59;
            local_fe8._8_4_ = uVar59;
            local_fe8._12_4_ = uVar59;
            uVar30 = *(undefined4 *)(lVar74 + 0x50 + uVar57 * 4);
            local_ff8._4_4_ = uVar30;
            local_ff8._0_4_ = uVar30;
            local_ff8._8_4_ = uVar30;
            local_ff8._12_4_ = uVar30;
            local_1048._4_4_ = uVar53;
            local_1048._0_4_ = uVar53;
            local_1048._8_4_ = uVar53;
            local_1048._12_4_ = uVar53;
            local_1038._4_4_ = uVar29;
            local_1038._0_4_ = uVar29;
            local_1038._8_4_ = uVar29;
            local_1038._12_4_ = uVar29;
            uVar53 = *(undefined4 *)((long)&local_10c8 + uVar57 * 4);
            local_1028._4_4_ = uVar53;
            local_1028._0_4_ = uVar53;
            local_1028._8_4_ = uVar53;
            local_1028._12_4_ = uVar53;
            uStack_1014 = local_1018;
            uStack_1010 = local_1018;
            uStack_100c = local_1018;
            uStack_1004 = local_1008;
            uStack_1000 = local_1008;
            uStack_ffc = local_1008;
            local_fd8 = context->user->instID[0];
            uStack_fd4 = local_fd8;
            uStack_fd0 = local_fd8;
            uStack_fcc = local_fd8;
            local_fc8 = context->user->instPrimID[0];
            uStack_fc4 = local_fc8;
            uStack_fc0 = local_fc8;
            uStack_fbc = local_fc8;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10f8 + uVar57 * 4);
            local_12c8 = *local_1248;
            args.valid = (int *)local_12c8;
            args.geometryUserPtr = pGVar35->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1048;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar35->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar35->intersectionFilterN)(&args);
            }
            if (local_12c8 == (undefined1  [16])0x0) {
              auVar121._8_4_ = 0xffffffff;
              auVar121._0_8_ = 0xffffffffffffffff;
              auVar121._12_4_ = 0xffffffff;
              auVar121 = auVar121 ^ _DAT_01f46b70;
            }
            else {
              p_Var42 = context->args->filter;
              if ((p_Var42 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar35->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var42)(&args);
              }
              auVar99._0_4_ = -(uint)(local_12c8._0_4_ == 0);
              auVar99._4_4_ = -(uint)(local_12c8._4_4_ == 0);
              auVar99._8_4_ = -(uint)(local_12c8._8_4_ == 0);
              auVar99._12_4_ = -(uint)(local_12c8._12_4_ == 0);
              auVar121 = auVar99 ^ _DAT_01f46b70;
              if (local_12c8 != (undefined1  [16])0x0) {
                auVar181 = blendvps(*(undefined1 (*) [16])args.hit,
                                    *(undefined1 (*) [16])(args.ray + 0xc0),auVar99);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                    *(undefined1 (*) [16])(args.ray + 0xd0),auVar99);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                    *(undefined1 (*) [16])(args.ray + 0xe0),auVar99);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                    *(undefined1 (*) [16])(args.ray + 0xf0),auVar99);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                    *(undefined1 (*) [16])(args.ray + 0x100),auVar99);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                    *(undefined1 (*) [16])(args.ray + 0x110),auVar99);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                    *(undefined1 (*) [16])(args.ray + 0x120),auVar99);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                    *(undefined1 (*) [16])(args.ray + 0x130),auVar99);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar181;
                auVar181 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                    *(undefined1 (*) [16])(args.ray + 0x140),auVar99);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar181;
              }
            }
            if ((_DAT_01f46b40 & auVar121) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1378._0_4_;
            }
            else {
              local_1378 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            valid.field_0.v[uVar57] = 0.0;
            valid.field_0.i[0] =
                 -(uint)(auVar207._0_4_ <= (float)local_1378._0_4_) & valid.field_0.i[0];
            valid.field_0.i[1] =
                 -(uint)(auVar207._4_4_ <= (float)local_1378._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] =
                 -(uint)(auVar207._8_4_ <= (float)local_1378._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] =
                 -(uint)(auVar207._12_4_ <= (float)local_1378._0_4_) & valid.field_0.i[3];
            uVar58 = uVar57;
            fVar145 = local_1058;
            fVar101 = fStack_1054;
            fVar102 = fStack_1050;
            fVar191 = fStack_104c;
            fVar172 = local_1068;
            fVar103 = fStack_1064;
            fVar104 = fStack_1060;
            fVar105 = fStack_105c;
            fVar81 = local_1078;
            fVar106 = fStack_1074;
            fVar107 = fStack_1070;
            fVar108 = fStack_106c;
            fVar82 = local_1088;
            fVar109 = fStack_1084;
            fVar110 = fStack_1080;
            fVar111 = fStack_107c;
            fVar185 = local_1098;
            fVar112 = fStack_1094;
            fVar124 = fStack_1090;
            fVar125 = fStack_108c;
            iVar51 = local_10a8;
            iVar238 = iStack_10a4;
            iVar240 = iStack_10a0;
            iVar242 = iStack_109c;
            _local_1328 = auVar207;
          }
          iVar52 = movmskps((int)uVar58,(undefined1  [16])valid.field_0);
          if (iVar52 == 0) goto LAB_0071b0d4;
          auVar151 = blendvps(_DAT_01f45a30,auVar207,(undefined1  [16])valid.field_0);
          auVar184._4_4_ = auVar151._0_4_;
          auVar184._0_4_ = auVar151._4_4_;
          auVar184._8_4_ = auVar151._12_4_;
          auVar184._12_4_ = auVar151._8_4_;
          auVar181 = minps(auVar184,auVar151);
          auVar122._0_8_ = auVar181._8_8_;
          auVar122._8_4_ = auVar181._0_4_;
          auVar122._12_4_ = auVar181._4_4_;
          auVar181 = minps(auVar122,auVar181);
          auVar123._0_8_ =
               CONCAT44(-(uint)(auVar181._4_4_ == auVar151._4_4_) & valid.field_0._4_4_,
                        -(uint)(auVar181._0_4_ == auVar151._0_4_) & valid.field_0._0_4_);
          auVar123._8_4_ = -(uint)(auVar181._8_4_ == auVar151._8_4_) & valid.field_0._8_4_;
          auVar123._12_4_ = -(uint)(auVar181._12_4_ == auVar151._12_4_) & valid.field_0._12_4_;
          iVar52 = movmskps(iVar52,auVar123);
          aVar100 = valid.field_0;
          if (iVar52 != 0) {
            aVar100.i[2] = auVar123._8_4_;
            aVar100._0_8_ = auVar123._0_8_;
            aVar100.i[3] = auVar123._12_4_;
          }
          uVar53 = movmskps(iVar52,(undefined1  [16])aVar100);
          uVar58 = CONCAT44((int)(uVar58 >> 0x20),uVar53);
          uVar57 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
            }
          }
          goto LAB_0071b86a;
        }
      }
LAB_0071b0d4:
      fVar80 = local_f98;
      fVar146 = fStack_f94;
      fVar126 = fStack_f90;
      fVar127 = fStack_f8c;
    }
    uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar181._4_4_ = uVar53;
    auVar181._0_4_ = uVar53;
    auVar181._8_4_ = uVar53;
    auVar181._12_4_ = uVar53;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }